

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# balk.cpp
# Opt level: O3

void __thiscall Balk::add_uniform_load(Balk *this,int shift,double segment_length,double value)

{
  undefined1 local_59;
  UniformLoad *local_58;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_50 [2];
  int local_3c;
  shared_ptr<Term> local_38;
  double local_20;
  double local_18;
  
  local_58 = (UniformLoad *)0x0;
  local_3c = shift;
  local_20 = value;
  local_18 = segment_length;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<UniformLoad,std::allocator<UniformLoad>,int&,double&,double&>
            (a_Stack_50,&local_58,(allocator<UniformLoad> *)&local_59,&local_3c,&local_18,&local_20)
  ;
  local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_ptr = &local_58->super_Term;
  local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       a_Stack_50[0]._M_pi;
  local_58 = (UniformLoad *)0x0;
  a_Stack_50[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>>::
  emplace_back<std::shared_ptr<Term>>
            ((vector<std::shared_ptr<Term>,std::allocator<std::shared_ptr<Term>>> *)&this->terms,
             &local_38);
  if (local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_38.super___shared_ptr<Term,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (a_Stack_50[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_50[0]._M_pi);
  }
  return;
}

Assistant:

void Balk::add_uniform_load(int shift, double segment_length, double value)
{
    terms.push_back(std::make_shared<UniformLoad>(shift, segment_length, value));
}